

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void driver(int input,int width,int height,pane_t **pane,buffer_t *buffer)

{
  pane_type_t type;
  uint uVar1;
  int iVar2;
  wchar_t wVar3;
  size_t sVar4;
  ulong options_size;
  pane_t *ppVar5;
  wchar_t wVar6;
  bool bVar7;
  int local_100;
  pane_type_t previous;
  int j;
  int selected;
  char *comment_2;
  undefined8 uStack_e8;
  int n;
  gpointer value;
  gpointer key;
  GHashTableIter i;
  char **comments_data;
  size_t comments_size;
  int64_t result;
  char *user_input_1;
  char *comment_1;
  char *comment;
  char *user_input;
  char name [72];
  buffer_t *buffer_local;
  pane_t **pane_local;
  int height_local;
  int width_local;
  int input_local;
  
  if (input == 10) {
LAB_001059fc:
    type = (*pane)->type;
    pane_unpost(*pane);
    wclear(_stdscr);
    render_status(buffer->path);
    ppVar5 = next_pane(type,buffer,width,height);
    *pane = ppVar5;
  }
  else if (input == 0x3b) {
    render_options(&EMPTY_OPT);
    snprintf((char *)&user_input,0x48,"Comment at offset .%08lx`%08lx",
             buffer->cursor & 0xffffffff00000000,buffer->cursor & 0xffffffff);
    comment = (char *)0x0;
    comment_1 = buffer_lookup_comment(buffer,buffer->cursor);
    prompt_input((char *)&user_input,comment_1,&comment);
    if (comment != (char *)0x0) {
      user_input_1 = trim(comment);
      sVar4 = strlen(user_input_1);
      if (sVar4 == 0) {
        buffer_remove_comment(buffer,buffer->cursor);
      }
      else {
        buffer_add_comment(buffer,buffer->cursor,user_input_1);
      }
      free(comment);
    }
  }
  else if (input == 0x3d) {
    render_options(&EMPTY_OPT);
    prompt_calculator((buffer_t_conflict *)buffer);
  }
  else if (input == 0x10b) {
    if ((buffer->editable != 0) || (iVar2 = buffer_try_reopen(buffer), iVar2 == 0))
    goto LAB_00105a83;
    prompt_error("The file could not be opened as writable.");
  }
  else if (input == 0x10d) {
    render_options(&EMPTY_OPT);
    result = 0;
    prompt_input("Goto",(char *)0x0,(char **)&result);
    comments_size = 0xffffffffffffffff;
    if (((result != 0) &&
        (iVar2 = calculator_eval(buffer,(char *)result,(int64_t *)&comments_size), iVar2 == 0)) &&
       (-1 < (long)comments_size)) {
      pane_scroll(*pane,comments_size);
    }
    free((void *)result);
  }
  else {
    if (input != 0x111) {
      if (input != 0x157) goto LAB_00105a83;
      goto LAB_001059fc;
    }
    uVar1 = g_hash_table_size(buffer->comments);
    options_size = (ulong)uVar1;
    if (options_size == 0) {
      prompt_error("No names.");
    }
    else {
      i.dummy6 = malloc(options_size << 3);
      g_hash_table_iter_init(&key,buffer->comments);
      comment_2._4_4_ = 0;
      while (iVar2 = g_hash_table_iter_next(&key,&value,&stack0xffffffffffffff18), iVar2 != 0) {
        asprintf((char **)&j,"%08x  %s",(ulong)value & 0xffffffff,uStack_e8);
        *(char **)((long)i.dummy6 + (long)comment_2._4_4_ * 8) = _j;
        comment_2._4_4_ = comment_2._4_4_ + 1;
      }
      wVar3 = prompt_menu("Names",(char **)i.dummy6,options_size,L'@',L'\0');
      g_hash_table_iter_init(&key,buffer->comments);
      comment_2._4_4_ = L'\0';
      while (iVar2 = g_hash_table_iter_next(&key,&value,&stack0xffffffffffffff18), iVar2 != 0) {
        wVar6 = comment_2._4_4_ + L'\x01';
        bVar7 = comment_2._4_4_ == wVar3;
        comment_2._4_4_ = wVar6;
        if (bVar7) {
          pane_scroll(*pane,(uint64_t)value);
        }
      }
      for (local_100 = 0; (ulong)(long)local_100 < options_size; local_100 = local_100 + 1) {
        free(*(void **)((long)i.dummy6 + (long)local_100 * 8));
      }
      free(i.dummy6);
    }
  }
  wclear(_stdscr);
LAB_00105a83:
  render_status(buffer->path);
  render_options((*pane)->options);
  pane_drive(*pane,input);
  return;
}

Assistant:

static void
driver(int input, int width, int height, pane_t **pane, buffer_t *buffer)
{
    switch (input) {
    case '=':
        render_options(&EMPTY_OPT);
        prompt_calculator(buffer);
        goto reset;
    case ';': {
        render_options(&EMPTY_OPT);

        char name[72];
        snprintf(name, sizeof(name), "Comment at offset .%08lx`%08lx",
            buffer->cursor & 0xffffffff00000000, buffer->cursor & 0x00000000ffffffff);

        char *user_input = NULL;
        {
            const char *comment = buffer_lookup_comment(buffer, buffer->cursor);
            prompt_input(name, comment, &user_input);
        }

        if (user_input != NULL) {
            char *comment = trim(user_input);

            if (strlen(comment) == 0) {
                buffer_remove_comment(buffer, buffer->cursor);
            } else {
                buffer_add_comment(buffer, buffer->cursor, comment);
            }

            free(user_input);
        }
        goto reset;
    }
    case KEY_F(5): {
        render_options(&EMPTY_OPT);

        char *user_input = NULL;
        prompt_input("Goto", NULL, &user_input);

        int64_t result = -1;
        if (user_input != NULL && calculator_eval(buffer, user_input, &result) == 0 && result >= 0) {
            pane_scroll(*pane, (uint64_t) result);
        }

        free(user_input);
        goto reset;
    }
    case KEY_F(9): {
        size_t comments_size = g_hash_table_size(buffer->comments);
        if (comments_size == 0) {
            prompt_error("No names.");
            goto reset;
        }

        char **comments_data = malloc(sizeof(char*) * comments_size);

        GHashTableIter i;
        gpointer key, value;
        g_hash_table_iter_init(&i, buffer->comments);
        int n = 0;
        while (g_hash_table_iter_next(&i, &key, &value)) {
            char *comment;
            asprintf(&comment, "%08x  %s", (uint32_t) (GPOINTER_TO_SIZE(key) & 0x00000000ffffffff), (char*) value);
            comments_data[n++] = comment;
        }

        int selected = prompt_menu("Names", (const char**) comments_data, comments_size, 64, 0);

        // Find the address of the selected name.
        //
        g_hash_table_iter_init(&i, buffer->comments);
        n = 0;
        while (g_hash_table_iter_next(&i, &key, &value)) {
            if (n++ == selected) {
                pane_scroll(*pane, GPOINTER_TO_SIZE(key));
            }
        }

        for (int j = 0; j < comments_size; j++) {
            free(comments_data[j]);
        }

        free(comments_data);
        goto reset;
    }
    case '\x0a':
    case KEY_ENTER: {
        pane_type_t previous = (*pane)->type;
        pane_unpost(*pane);
        clear();
        render_status(buffer->path);
        *pane = next_pane(previous, buffer, width, height);
        goto reset;
    }
    case KEY_F(3):
        if (!buffer->editable) {
            if (buffer_try_reopen(buffer)) {
                prompt_error("The file could not be opened as writable.");
                goto reset;
            }
        }
        goto drive;
    default:
drive:
        render_status(buffer->path);
        render_options((*pane)->options);
        pane_drive(*pane, input);
    }

    return;
reset:
    clear();
    goto drive;
}